

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall cmGeneratedFileStreamBase::Open(cmGeneratedFileStreamBase *this,char *name)

{
  char *path;
  string *source;
  undefined1 local_38 [8];
  string dir;
  char *name_local;
  cmGeneratedFileStreamBase *this_local;
  
  dir.field_2._8_8_ = name;
  std::__cxx11::string::operator=((string *)this,name);
  source = &this->TempName;
  std::__cxx11::string::operator=((string *)source,(char *)dir.field_2._8_8_);
  std::__cxx11::string::operator+=((string *)source,".tmp");
  cmsys::SystemTools::RemoveFile(source);
  cmsys::SystemTools::GetFilenamePath((string *)local_38,source);
  path = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::MakeDirectory(path);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmGeneratedFileStreamBase::Open(const char* name)
{
  // Save the original name of the file.
  this->Name = name;

  // Create the name of the temporary file.
  this->TempName = name;
#if defined(__VMS)
  this->TempName += "_tmp";
#else
  this->TempName += ".tmp";
#endif

  // Make sure the temporary file that will be used is not present.
  cmSystemTools::RemoveFile(this->TempName);

  std::string dir = cmSystemTools::GetFilenamePath(this->TempName);
  cmSystemTools::MakeDirectory(dir.c_str());
}